

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

pair<mjs::token,_unsigned_long> *
mjs::anon_unknown_2::skip_comment
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,wstring_view *text,size_t pos,
          version v)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  runtime_error *this;
  bool bVar4;
  token local_88;
  byte local_5e;
  byte local_5d;
  bool line_terminator_seen;
  bool last_was_asterisk;
  token local_50;
  undefined1 local_25;
  version local_24;
  bool is_single_line;
  size_t sStack_20;
  version v_local;
  size_t pos_local;
  wstring_view *text_local;
  
  local_24 = v;
  sStack_20 = pos;
  pos_local = (size_t)text;
  text_local = (wstring_view *)__return_storage_ptr__;
  sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(text);
  if (sVar2 <= pos) {
    __assert_fail("pos < text.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x89,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                 );
  }
  pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,sStack_20)
  ;
  bVar4 = true;
  if (*pvVar3 != 0x2f) {
    pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,
                        sStack_20);
    bVar4 = *pvVar3 == 0x2a;
  }
  sVar2 = sStack_20;
  if (!bVar4) {
    __assert_fail("text[pos] == \'/\' || text[pos] == \'*\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x8a,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                 );
  }
  sStack_20 = sStack_20 + 1;
  pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,sVar2);
  local_25 = *pvVar3 == 0x2f;
  if ((bool)local_25) {
    for (; uVar1 = sStack_20,
        sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local),
        uVar1 < sVar2; sStack_20 = sStack_20 + 1) {
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,
                          sStack_20);
      bVar4 = is_line_terminator(*pvVar3,local_24);
      if (bVar4) break;
    }
    token::token(&local_50,whitespace);
    std::pair<mjs::token,_unsigned_long>::pair<mjs::token,_unsigned_long_&,_true>
              (__return_storage_ptr__,&local_50,&stack0xffffffffffffffe0);
    token::~token(&local_50);
  }
  else {
    local_5d = 0;
    local_5e = 0;
    while( true ) {
      uVar1 = sStack_20;
      sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local);
      if (sVar2 <= uVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Unterminated multi-line comment");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,
                          sStack_20);
      if ((*pvVar3 == 0x2f) && ((local_5d & 1) != 0)) break;
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,
                          sStack_20);
      local_5d = *pvVar3 == 0x2a;
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,
                          sStack_20);
      bVar4 = is_line_terminator(*pvVar3,local_24);
      if (bVar4) {
        local_5e = 1;
      }
      sStack_20 = sStack_20 + 1;
    }
    token::token(&local_88,local_5e & line_terminator);
    sStack_20 = sStack_20 + 1;
    std::pair<mjs::token,_unsigned_long>::pair<mjs::token,_unsigned_long_&,_true>
              (__return_storage_ptr__,&local_88,&stack0xffffffffffffffe0);
    token::~token(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<token, size_t> skip_comment(const std::wstring_view& text, size_t pos, version v) {
    assert(pos < text.size());
    assert(text[pos] == '/' || text[pos] == '*');
    const bool is_single_line = text[pos++] == '/';
    if (is_single_line) {
        for (; pos < text.size(); ++pos) {
            if (is_line_terminator(text[pos], v)) {
                // Don't consume line terminator
                break;
            }
        }
        return {token{token_type::whitespace}, pos};
    } else {
        for (bool last_was_asterisk = false, line_terminator_seen = false; pos < text.size(); ++pos) {
            if (text[pos] == '/' && last_was_asterisk) {
                return {token{line_terminator_seen ? token_type::line_terminator : token_type::whitespace}, ++pos};
            }
            last_was_asterisk = text[pos] == '*';
            if (is_line_terminator(text[pos], v)) {
                line_terminator_seen = true;
            }
        }
        throw std::runtime_error("Unterminated multi-line comment");
    }
}